

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

MixMaterial *
pbrt::MixMaterial::Create
          (MaterialHandle *materials,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  bool bVar1;
  MixMaterial *pMVar2;
  char *message;
  initializer_list<pbrt::FloatTextureHandle> ftex;
  allocator<char> local_61;
  FloatTextureHandle amount;
  MaterialHandle *materials_local;
  Allocator alloc_local;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_48 [4];
  
  materials_local = materials;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"amount",&local_61);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&amount,(string *)parameters,0.5,
             (memory_resource *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (*(char *)(Options + 0xf) == '\x01') {
    if ((*(short *)((long)&(materials->
                           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                           ).bits + 6) == 0xb) ||
       ((materials[1].
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits & 0xffff000000000000) == 0xb000000000000)) {
      message = 
      "The GPU renderer doesn\'t currently support using \"mix\" materials as parameters to the \"mix\" material."
      ;
    }
    else {
      local_48[0] = amount.
                    super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                    .bits;
      ftex._M_len = 1;
      ftex._M_array = (iterator)local_48;
      bVar1 = BasicTextureEvaluator::CanEvaluate
                        ((BasicTextureEvaluator *)&local_61,ftex,
                         (initializer_list<pbrt::SpectrumTextureHandle>)(ZEXT816(0) << 0x40));
      if (bVar1) goto LAB_003534ab;
      message = 
      "The GPU renderer currently only supports basic textures for its \"amount\" parameter.";
    }
    ErrorExit(loc,message);
  }
LAB_003534ab:
  pMVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MixMaterial,pbrt::MaterialHandle*&,pbrt::FloatTextureHandle&>
                     (&alloc_local,&materials_local,&amount);
  return pMVar2;
}

Assistant:

MixMaterial *MixMaterial::Create(MaterialHandle materials[2],
                                 const TextureParameterDictionary &parameters,
                                 const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle amount = parameters.GetFloatTexture("amount", 0.5f, alloc);

    if (Options->useGPU) {
        // Check for this stuff here, where we can include the FileLoc in
        // the error message. Note that both of these limitations could be
        // relaxed if they were problematic; the issue is that we currently
        // resolve MixMaterials in the closest hit shader, where we'd like
        // to, for example, not introduce the complexity of potentially
        // recursively evaluating textures, etc.
        if (materials[0].Is<MixMaterial>() || materials[1].Is<MixMaterial>())
            ErrorExit(loc, "The GPU renderer doesn't currently support using "
                           "\"mix\" materials as parameters to the \"mix\" material.");
        if (!BasicTextureEvaluator().CanEvaluate({amount}, {}))
            ErrorExit(loc, "The GPU renderer currently only supports basic textures "
                           "for its \"amount\" parameter.");
    }

    return alloc.new_object<MixMaterial>(materials, amount);
}